

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall backend::codegen::Codegen::deal_phi(Codegen *this,PhiInst *phi)

{
  char *pcVar1;
  pointer pVVar2;
  PhiInst *tag;
  char *pcVar3;
  VarId *x;
  pointer pVVar4;
  VarId dest;
  ostream local_149;
  Function *local_148;
  size_type local_140;
  undefined1 local_138 [16];
  char *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider _Stack_110;
  undefined **local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0;
  undefined7 uStack_ef;
  undefined1 local_e0;
  undefined1 local_d8 [25];
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 uStack_98;
  size_t local_90;
  bool local_88;
  Codegen *local_80;
  undefined **local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined **local_60;
  uint32_t local_58;
  VarId local_50;
  undefined **local_40;
  uint32_t local_38;
  
  local_60 = &PTR_display_001eb100;
  local_58 = (phi->super_Inst).dest.id;
  local_149 = (ostream)0x0;
  tag = phi;
  local_80 = this;
  AixLog::operator<<(&local_149,(Severity *)phi);
  local_100._M_allocated_capacity = (size_type)&local_f0;
  local_108 = &PTR__Tag_001eaf88;
  local_100._8_8_ = 0;
  local_f0 = 0;
  local_e0 = 1;
  AixLog::operator<<((ostream *)&local_108,(Tag *)tag);
  local_70 = std::chrono::_V2::system_clock::now();
  local_78 = &PTR__Timestamp_001eaf58;
  local_68 = 0;
  AixLog::operator<<((ostream *)&local_78,(Timestamp *)tag);
  local_148 = (Function *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"deal_phi","");
  pcVar1 = local_120._M_local_buf + 8;
  pcVar3 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp";
  local_128 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
             ,"");
  local_d8._8_8_ = local_d8 + 0x18;
  local_d8._0_8_ = &PTR__Function_001eafb8;
  if (local_148 == (Function *)local_138) {
    uStack_b8 = local_138._8_8_;
  }
  else {
    local_d8._8_8_ = local_148;
  }
  uStack_bf = local_138._1_7_;
  local_d8[0x18] = local_138[0];
  local_b0._M_p = local_a8._M_local_buf + 8;
  local_d8._16_8_ = local_140;
  local_140 = 0;
  local_138[0] = 0;
  if (local_128 == pcVar1) {
    uStack_98 = _Stack_110._M_p;
  }
  else {
    local_b0._M_p = local_128;
  }
  local_a8._9_7_ = local_120._9_7_;
  local_a8._M_local_buf[8] = local_120._M_local_buf[8];
  local_a8._M_allocated_capacity = local_120._M_allocated_capacity;
  local_120._M_allocated_capacity = 0;
  local_120._M_local_buf[8] = '\0';
  local_90 = 0x178;
  local_88 = false;
  local_148 = (Function *)local_138;
  local_128 = pcVar1;
  AixLog::operator<<((ostream *)local_d8,(Function *)pcVar3);
  (*(code *)*local_60)(&local_60,&std::clog);
  pcVar3 = " <- ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," <- ",4);
  AixLog::Function::~Function((Function *)local_d8);
  if (local_128 != pcVar1) {
    pcVar3 = (char *)(CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
    operator_delete(local_128,(ulong)pcVar3);
  }
  if (local_148 != (Function *)local_138) {
    pcVar3 = (char *)(CONCAT71(local_138._1_7_,local_138[0]) + 1);
    operator_delete(local_148,(ulong)pcVar3);
  }
  local_108 = &PTR__Tag_001eaf88;
  if ((undefined1 *)local_100._M_allocated_capacity != &local_f0) {
    pcVar3 = (char *)(CONCAT71(uStack_ef,local_f0) + 1);
    operator_delete((void *)local_100._M_allocated_capacity,(ulong)pcVar3);
  }
  pVVar4 = (phi->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (phi->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar4 != pVVar2) {
    do {
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)pcVar3);
      local_108 = &PTR__Tag_001eaf88;
      local_100._M_allocated_capacity = (size_type)&local_f0;
      local_100._8_8_ = 0;
      local_f0 = 0;
      local_e0 = 1;
      AixLog::operator<<((ostream *)&local_108,(Tag *)pcVar3);
      local_70 = std::chrono::_V2::system_clock::now();
      local_78 = &PTR__Timestamp_001eaf58;
      local_68 = 0;
      AixLog::operator<<((ostream *)&local_78,(Timestamp *)pcVar3);
      local_148 = (Function *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"deal_phi","");
      local_128 = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,"");
      local_d8._0_8_ = &PTR__Function_001eafb8;
      local_b0._M_p = local_a8._M_local_buf + 8;
      if (local_148 == (Function *)local_138) {
        uStack_b8 = local_138._8_8_;
        local_d8._8_8_ = (Function *)(local_d8 + 0x18);
      }
      else {
        local_d8._8_8_ = local_148;
      }
      uStack_bf = local_138._1_7_;
      local_d8[0x18] = local_138[0];
      local_d8._16_8_ = local_140;
      local_140 = 0;
      local_138[0] = 0;
      if (local_128 == pcVar1) {
        uStack_98 = _Stack_110._M_p;
      }
      else {
        local_b0._M_p = local_128;
      }
      local_a8._9_7_ = local_120._9_7_;
      local_a8._M_local_buf[8] = local_120._M_local_buf[8];
      local_a8._M_allocated_capacity = local_120._M_allocated_capacity;
      local_120._M_allocated_capacity = 0;
      local_120._M_local_buf[8] = '\0';
      local_90 = 0x17a;
      local_88 = false;
      local_148 = (Function *)local_138;
      local_128 = pcVar1;
      AixLog::operator<<((ostream *)local_d8,(Function *)(local_d8 + 0x18));
      (**(pVVar4->super_Displayable)._vptr_Displayable)(pVVar4,&std::clog);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ",1);
      AixLog::Function::~Function((Function *)local_d8);
      if (local_128 != pcVar1) {
        operator_delete(local_128,CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
      }
      if (local_148 != (Function *)local_138) {
        operator_delete(local_148,CONCAT71(local_138._1_7_,local_138[0]) + 1);
      }
      local_108 = &PTR__Tag_001eaf88;
      if ((undefined1 *)local_100._M_allocated_capacity != &local_f0) {
        operator_delete((void *)local_100._M_allocated_capacity,CONCAT71(uStack_ef,local_f0) + 1);
      }
      local_40 = &PTR_display_001eb100;
      local_38 = local_58;
      local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_50.id = pVVar4->id;
      pcVar3 = (char *)&local_40;
      add_collapsed_var(local_80,(VarId *)pcVar3,&local_50);
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 != pVVar2);
  }
  local_149 = (ostream)0x0;
  AixLog::operator<<(&local_149,(Severity *)pcVar3);
  local_108 = &PTR__Tag_001eaf88;
  local_100._M_allocated_capacity = (size_type)&local_f0;
  local_100._8_8_ = 0;
  local_f0 = 0;
  local_e0 = 1;
  AixLog::operator<<((ostream *)&local_108,(Tag *)pcVar3);
  local_70 = std::chrono::_V2::system_clock::now();
  local_78 = &PTR__Timestamp_001eaf58;
  local_68 = 0;
  AixLog::operator<<((ostream *)&local_78,(Timestamp *)pcVar3);
  local_148 = (Function *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"deal_phi","");
  local_128 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
             ,"");
  local_d8._0_8_ = &PTR__Function_001eafb8;
  local_b0._M_p = local_a8._M_local_buf + 8;
  if (local_148 == (Function *)local_138) {
    uStack_b8 = local_138._8_8_;
    local_d8._8_8_ = (Function *)(local_d8 + 0x18);
  }
  else {
    local_d8._8_8_ = local_148;
  }
  uStack_bf = local_138._1_7_;
  local_d8[0x18] = local_138[0];
  local_d8._16_8_ = local_140;
  local_140 = 0;
  local_138[0] = 0;
  if (local_128 == pcVar1) {
    uStack_98 = _Stack_110._M_p;
  }
  else {
    local_b0._M_p = local_128;
  }
  local_a8._9_7_ = local_120._9_7_;
  local_a8._M_local_buf[8] = local_120._M_local_buf[8];
  local_a8._M_allocated_capacity = local_120._M_allocated_capacity;
  local_120._M_allocated_capacity = 0;
  local_120._M_local_buf[8] = '\0';
  local_90 = 0x17e;
  local_88 = false;
  local_148 = (Function *)local_138;
  local_128 = pcVar1;
  AixLog::operator<<((ostream *)local_d8,(Function *)(local_d8 + 0x18));
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_d8);
  if (local_128 != pcVar1) {
    operator_delete(local_128,CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
  }
  if (local_148 != (Function *)local_138) {
    operator_delete(local_148,CONCAT71(local_138._1_7_,local_138[0]) + 1);
  }
  local_108 = &PTR__Tag_001eaf88;
  if ((undefined1 *)local_100._M_allocated_capacity != &local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return;
}

Assistant:

void Codegen::deal_phi(mir::inst::PhiInst& phi) {
  auto dest = phi.dest;
  LOG(TRACE) << dest << " <- ";
  for (auto& x : phi.vars) {
    LOG(TRACE) << x << " ";
    add_collapsed_var(dest, x);
    // var_collapse.insert({x, dest});
  }
  LOG(TRACE) << std::endl;
}